

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O2

void google::protobuf::internal::SingularFieldHelper<3>::
     Serialize<google::protobuf::internal::ArrayOutput>
               (void *field,FieldMetadata *md,ArrayOutput *output)

{
  WriteTagTo<google::protobuf::internal::ArrayOutput>(md->tag,output);
  OutputHelper<google::protobuf::internal::ArrayOutput,_3>::Serialize(field,output);
  return;
}

Assistant:

static void Serialize(const void* field, const FieldMetadata& md, O* output) {
    WriteTagTo(md.tag, output);
    SerializeTo<type>(field, output);
  }